

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesMemoryGetBandwidth(zes_mem_handle_t hMemory,zes_mem_bandwidth_t *pBandwidth)

{
  zes_pfnMemoryGetBandwidth_t pfnGetBandwidth;
  dditable_t *dditable;
  ze_result_t result;
  zes_mem_bandwidth_t *pBandwidth_local;
  zes_mem_handle_t hMemory_local;
  
  if (*(code **)(*(long *)(hMemory + 8) + 0xbd0) == (code *)0x0) {
    hMemory_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMemory_local._4_4_ =
         (**(code **)(*(long *)(hMemory + 8) + 0xbd0))(*(undefined8 *)hMemory,pBandwidth);
  }
  return hMemory_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetBandwidth(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_bandwidth_t* pBandwidth                 ///< [in,out] Will contain the total number of bytes read from and written
                                                        ///< to memory, as well as the current maximum bandwidth.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_mem_object_t*>( hMemory )->dditable;
        auto pfnGetBandwidth = dditable->zes.Memory.pfnGetBandwidth;
        if( nullptr == pfnGetBandwidth )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMemory = reinterpret_cast<zes_mem_object_t*>( hMemory )->handle;

        // forward to device-driver
        result = pfnGetBandwidth( hMemory, pBandwidth );

        return result;
    }